

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

logical pnga_update4_ghosts(Integer g_a)

{
  int *piVar1;
  int *piVar2;
  short sVar3;
  int *piVar4;
  Integer proc;
  logical lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  int *stride_arr;
  double *pdVar12;
  long lVar13;
  ulong uVar14;
  int msglen;
  Integer index [7];
  Integer width [7];
  char rcv_name [32];
  char send_name [32];
  int local_14c;
  char *local_148;
  char *local_140;
  long local_138;
  double local_130;
  int local_124;
  long local_120;
  long local_118;
  long local_110;
  int *local_108;
  int *local_100;
  ulong local_f8 [8];
  long local_b8 [8];
  char local_78 [32];
  char local_58 [40];
  
  proc = pnga_nodeid();
  lVar5 = pnga_has_ghosts(g_a);
  if (lVar5 != 0) {
    lVar13 = g_a + 1000;
    sVar3 = GA[lVar13].ndim;
    lVar9 = (long)sVar3;
    pdVar12 = GA[lVar13].cache;
    iVar8 = GA[lVar13].elemsize;
    if (0 < lVar9) {
      memcpy(local_b8,GA[g_a + 1000].width,lVar9 * 8);
    }
    pnga_proc_topology(g_a,proc,(Integer *)local_f8);
    local_130 = *pdVar12;
    lVar6 = (long)local_130 / (long)iVar8;
    builtin_strncpy(local_58,"send_buffer",0xc);
    builtin_strncpy(local_78,"receive_buffer",0xf);
    local_140 = (char *)pnga_malloc(lVar6,GA[lVar13].type,local_58);
    local_148 = (char *)pnga_malloc(lVar6,GA[lVar13].type,local_78);
    if (0 < sVar3) {
      pdVar12 = pdVar12 + 1;
      local_124 = sVar3 + -1;
      local_120 = g_a * 0x368 + 0xd4ee0;
      lVar13 = 0;
      local_138 = 0;
      local_118 = lVar9;
      do {
        pcVar11 = local_140;
        lVar6 = lVar9;
        if (local_b8[lVar13] != 0) {
          stride_arr = (int *)(lVar9 * 4 + 0x20 + (long)pdVar12);
          piVar1 = stride_arr + lVar9;
          local_100 = stride_arr + lVar9 + 2;
          armci_write_strided((void *)*pdVar12,local_124,(int *)(pdVar12 + 4),local_100,local_140);
          if ((double)GAme != pdVar12[2]) {
            uVar14 = (ulong)*(int *)((long)GA->dims + lVar13 * 4 + local_120 + -0x30);
            iVar8 = SUB84(pdVar12[2],0);
            iVar10 = (int)local_138;
            if ((uVar14 & 1) == 0) {
              if ((local_f8[lVar13] & 1) == 0) {
                armci_msg_rcv(iVar10,local_148,SUB84(local_130,0),&local_14c,*(int *)(pdVar12 + 3));
              }
              else {
                armci_msg_snd(iVar10,local_140,*piVar1,iVar8);
              }
              if ((local_f8[lVar13] & 1) == 0) {
                armci_msg_snd((int)local_138,local_140,*piVar1,*(int *)(pdVar12 + 2));
                pcVar11 = local_148;
                goto LAB_0018b5f6;
              }
            }
            else {
              uVar14 = uVar14 - 1;
              if ((local_f8[lVar13] & 1) == 0) {
                uVar7 = uVar14;
                if (local_f8[lVar13] != uVar14) {
                  armci_msg_rcv(iVar10,local_148,SUB84(local_130,0),&local_14c,*(int *)(pdVar12 + 3)
                               );
                  goto LAB_0018b563;
                }
              }
              else {
                armci_msg_snd(iVar10,local_140,*piVar1,iVar8);
LAB_0018b563:
                uVar7 = local_f8[lVar13];
              }
              if ((uVar7 & 1) == 0) {
                if (uVar7 != 0) {
                  armci_msg_snd((int)local_138,local_140,*piVar1,*(int *)(pdVar12 + 2));
                }
              }
              else {
                armci_msg_rcv((int)local_138,local_148,SUB84(local_130,0),&local_14c,
                              *(int *)(pdVar12 + 3));
              }
              uVar7 = local_f8[lVar13];
              if (uVar7 == 0) {
                armci_msg_snd((int)local_138,local_140,*piVar1,*(int *)(pdVar12 + 2));
                uVar7 = local_f8[lVar13];
              }
              pcVar11 = local_148;
              if (uVar7 != uVar14) goto LAB_0018b5f6;
            }
            pcVar11 = local_148;
            armci_msg_rcv((int)local_138,local_148,SUB84(local_130,0),&local_14c,
                          *(int *)(pdVar12 + 3));
          }
LAB_0018b5f6:
          piVar4 = local_100;
          iVar8 = local_124;
          armci_read_strided((void *)pdVar12[1],local_124,stride_arr,local_100,pcVar11);
          pcVar11 = local_140;
          local_108 = piVar1 + lVar9 * 2 + 10;
          piVar2 = local_108 + lVar9;
          local_110 = lVar13;
          armci_write_strided(*(void **)(piVar4 + lVar9),iVar8,piVar1 + lVar9 + 10,
                              piVar1 + lVar9 * 3 + 0xc,local_140);
          lVar13 = local_110;
          if (GAme != *(long *)(stride_arr + lVar9 * 2 + 8)) {
            iVar8 = (int)local_138 + 1;
            uVar14 = (ulong)*(int *)((long)GA->dims + local_110 * 4 + local_120 + -0x30);
            iVar10 = (int)*(long *)(stride_arr + lVar9 * 2 + 8);
            if ((uVar14 & 1) == 0) {
              if ((local_f8[local_110] & 1) == 0) {
                armci_msg_rcv(iVar8,local_148,SUB84(local_130,0),&local_14c,iVar10);
              }
              else {
                armci_msg_snd(iVar8,local_140,*piVar2,piVar1[lVar9 + 6]);
              }
              if ((local_f8[lVar13] & 1) == 0) {
                armci_msg_snd(iVar8,local_140,*piVar2,piVar1[lVar9 + 6]);
                pcVar11 = local_148;
              }
              else {
LAB_0018b796:
                pcVar11 = local_148;
                armci_msg_rcv(iVar8,local_148,SUB84(local_130,0),&local_14c,piVar1[lVar9 + 8]);
              }
            }
            else {
              if ((local_f8[local_110] & 1) == 0) {
                if (local_f8[local_110] != 0) {
                  armci_msg_rcv(iVar8,local_148,SUB84(local_130,0),&local_14c,iVar10);
                }
              }
              else {
                armci_msg_snd(iVar8,local_140,*piVar2,piVar1[lVar9 + 6]);
              }
              uVar14 = uVar14 - 1;
              if ((local_f8[lVar13] & 1) == 0) {
                if (local_f8[lVar13] != uVar14) {
                  armci_msg_snd(iVar8,local_140,*piVar2,piVar1[lVar9 + 6]);
                }
              }
              else {
                armci_msg_rcv(iVar8,local_148,SUB84(local_130,0),&local_14c,piVar1[lVar9 + 8]);
              }
              uVar7 = local_f8[lVar13];
              if (uVar7 == uVar14) {
                armci_msg_snd(iVar8,local_140,*piVar2,piVar1[lVar9 + 6]);
                uVar7 = local_f8[lVar13];
              }
              pcVar11 = local_148;
              if (uVar7 == 0) goto LAB_0018b796;
            }
          }
          lVar6 = local_118;
          pdVar12 = (double *)(piVar2 + local_118 + 2);
          armci_read_strided(*(void **)(piVar1 + lVar9 + 4),local_124,local_108,
                             piVar1 + lVar9 * 3 + 0xc,pcVar11);
          local_138 = local_138 + 2;
        }
        lVar13 = lVar13 + 1;
        lVar9 = lVar6;
      } while (lVar6 != lVar13);
    }
    pnga_free(local_148);
    pnga_free(local_140);
  }
  return 1;
}

Assistant:

logical pnga_update4_ghosts(Integer g_a)
{
  Integer idx, i, handle=GA_OFFSET + g_a;
  Integer *size, bufsize, buflen, ndim, elemsize;
  Integer *proc_rem_snd, *proc_rem_rcv, pmax;
  Integer msgcnt, *length;
  Integer index[MAXDIM], width[MAXDIM];
  int *stride_snd, *stride_rcv, *count, msglen;
  char **ptr_snd, **ptr_rcv, *cache, *current;
  char send_name[32], rcv_name[32];
  void *snd_ptr, *rcv_ptr, *snd_ptr_orig, *rcv_ptr_orig;
  Integer me = pnga_nodeid();
  /*Integer p_handle;*/

  /* This routine makes use of the shift algorithm to update data in the
   * ghost cells bounding the local block of visible data. The shift
   * algorithm starts by updating the blocks of data along the first
   * dimension by grabbing a block of data that is width[0] deep but
   * otherwise matches the  dimensions of the data residing on the
   * calling processor. The update of the second dimension, however,
   * grabs a block that is width[1] deep in the second dimension but is
   * ldim0 + 2*width[0] in the first dimensions where ldim0 is the
   * size of the visible data along the first dimension. The remaining
   * dimensions are left the same. For the next update, the width of the
   * second dimension is also increased by 2*width[1] and so on. This
   * algorith makes use of the fact that data for the dimensions that
   * have already been updated is available on each processor and can be
   * used in the updates of subsequent dimensions. The total number of
   * separate updates is 2*ndim, an update in the negative and positive
   * directions for each dimension.
   *
   * This implementation make use of explicit message passing to perform
   * the update. Separate message types for the updates in each coordinate
   * direction are used to maintain synchronization locally and to
   * guarantee that the data is present before the updates in a new
   * coordinate direction take place.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  ndim = GA[handle].ndim;
  /*p_handle = GA[handle].p_handle;*/
  cache = (char *)GA[handle].cache;
  elemsize = GA[handle].elemsize;
  for (i=0; i<ndim; i++) {
    width[i] = (Integer)GA[handle].width[i];
  }

  msgcnt = 0;

  /* Get indices of processor in virtual grid */
  pnga_proc_topology(g_a, me, index);

  size = (Integer*)cache;
  current = (char*)(size+1);
  bufsize = *size;
  buflen = bufsize/elemsize;
#if GHOST_PRINT
  printf("p[%d] bufsize: %d buflen: %d\n", GAme, bufsize, buflen);
  fflush(stdout);
#endif

  strcpy(send_name,"send_buffer");
  strcpy(rcv_name,"receive_buffer");
  snd_ptr_orig = snd_ptr = pnga_malloc(buflen, GA[handle].type, send_name);
  rcv_ptr_orig = rcv_ptr = pnga_malloc(buflen, GA[handle].type, rcv_name);

  /* loop over dimensions for sequential update using shift algorithm */
  for (idx=0; idx < ndim; idx++) {

    /* Do not bother with update if nwidth is zero */
    if (width[idx] != 0) {

      /* send messages in negative direction */
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

#if GHOST_PRINT
      printf("p[%d] 1: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)*ptr_snd,
              (Integer)*ptr_rcv);
      printf("p[%d] 1: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)*length, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d] 1: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d] 1: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d] 1: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d] 1: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d] 1: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      /* Fill send buffer with data. */
      armci_write_strided(*ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);
#if GHOST_PRINT
      printf("p[%d] completed armci_write_strided\n",GAme);
      fflush(stdout);
#endif

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

      if (GAme != *proc_rem_snd) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else if (index[idx] != pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else if (index[idx] != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          if (index[idx] == pmax) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      msgcnt++;
      /* copy data back into global array */
      armci_read_strided(*ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
#if GHOST_PRINT
      printf("p[%d] completed armci_read_strided\n",GAme);
      fflush(stdout);
#endif

      /* send messages in positive direction */
      snd_ptr = snd_ptr_orig;
      rcv_ptr = rcv_ptr_orig;

      ptr_snd = (char**)current;
      ptr_rcv = (char**)(ptr_snd+1);
      proc_rem_snd = (Integer*)(ptr_rcv+1);
      proc_rem_rcv = (Integer*)(proc_rem_snd+1);
      stride_snd = (int*)(proc_rem_rcv+1);
      stride_rcv = (int*)(stride_snd+ndim);
      length = (Integer*)(stride_rcv+ndim);
      count = (int*)(length+1);
      current = (char*)(count+ndim);

#if GHOST_PRINT
      printf("p[%d] 2: ptr_snd: %d ptr_rcv: %d\n", GAme, (Integer)*ptr_snd,
              (Integer)*ptr_rcv);
      printf("p[%d] 2: length: %d proc_rem_snd: %d proc_rem_rcv: %d\n",
          GAme, (int)*length, (int)*proc_rem_snd, (int)*proc_rem_rcv);
      printf("p[%d] 2: count[0]: %d stride_rcv[0]: %d stride_rcv[1]: %d\n",
          GAme, count[0], stride_rcv[0],stride_rcv[1]);
      printf("p[%d] 2: count[1]: %d stride_rcv[2]: %d stride_rcv[3]: %d\n",
          GAme, count[1], stride_rcv[2],stride_rcv[3]);
      printf("p[%d] 2: count[2]: %d stride_snd[0]: %d stride_snd[1]: %d\n",
          GAme, count[2], stride_snd[0],stride_snd[1]);
      printf("p[%d] 2: count[3]: %d stride_snd[2]: %d stride_snd[3]: %d\n",
          GAme, count[3], stride_snd[2],stride_snd[3]);
      printf("p[%d] 2: snd_ptr: %d rcv_ptr: %d\n", GAme, (Integer)snd_ptr,
          (Integer)rcv_ptr);
      fflush(stdout);
#endif
      /* Fill send buffer with data. */
      armci_write_strided(*ptr_snd, (int)ndim-1, stride_snd, count, snd_ptr);

      /* Send Messages. If processor has odd index in direction idx, it
       * sends message first, if processor has even index it receives
       * message first. Then process is reversed. Also need to account
       * for whether or not there are an odd number of processors along
       * update direction. */

      if (GAme != *proc_rem_rcv) {
        if (GA[handle].nblock[idx]%2 == 0) {
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
        } else {
          pmax = GA[handle].nblock[idx] - 1;
          if (index[idx]%2 != 0) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          } else if (index[idx] != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
          if (index[idx]%2 != 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          } else if (index[idx] != pmax) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          /* make up for odd processor at end of string */
          if (index[idx] == pmax) {
            armci_msg_snd(msgcnt, snd_ptr, *length, *proc_rem_snd);
          }
          if (index[idx] == 0) {
            armci_msg_rcv(msgcnt, rcv_ptr, bufsize, &msglen, *proc_rem_rcv);
          }
        }
      } else {
        rcv_ptr = snd_ptr;
      }
      /* copy data back into global array */
      armci_read_strided(*ptr_rcv, (int)ndim-1, stride_rcv, count, rcv_ptr);
      msgcnt++;
    }
  }

  pnga_free(rcv_ptr_orig);
  pnga_free(snd_ptr_orig);
  return TRUE;
}